

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNABase::SetReg(OPNABase *this,uint addr,uint data)

{
  byte bVar1;
  uint8 data_00;
  int iVar2;
  uint32 local_34;
  uint local_1c;
  int c;
  uint data_local;
  uint addr_local;
  OPNABase *this_local;
  
  local_1c = addr & 3;
  data_00 = (uint8)data;
  switch(addr) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    PSG::SetReg(&(this->super_OPNBase).psg,addr,data_00);
    break;
  default:
    if (local_1c < 3) {
      if ((addr & 0x100) != 0) {
        local_1c = local_1c + 3;
      }
      OPNBase::SetParameter
                (&this->super_OPNBase,
                 (Channel4 *)(this->adpcmreg + (long)(int)local_1c * 0x2e0 + 0xf),addr,data);
    }
    break;
  case 0x22:
    bVar1 = this->reg22;
    this->reg22 = data_00;
    if (((bVar1 ^ data) & 8) != 0) {
      this->lfocount = 0;
    }
    if ((this->reg22 & 8) == 0) {
      local_34 = 0;
    }
    else {
      local_34 = *(uint32 *)(OPNBase::lfotable + (long)(int)(this->reg22 & 7) * 4);
    }
    this->lfodcount = local_34;
    break;
  case 0x24:
  case 0x25:
    Timer::SetTimerA((Timer *)this,addr,data);
    break;
  case 0x26:
    Timer::SetTimerB((Timer *)this,data);
    break;
  case 0x27:
    Timer::SetTimerControl((Timer *)this,data);
    break;
  case 0x28:
    if ((data & 3) < 3) {
      iVar2 = 0;
      if ((data & 4) != 0) {
        iVar2 = 3;
      }
      Channel4::KeyControl
                ((Channel4 *)(this->adpcmreg + (long)(int)((data & 3) + iVar2) * 0x2e0 + 0xf),
                 data >> 4);
    }
    break;
  case 0x29:
    this->reg29 = data;
    break;
  case 0x2d:
  case 0x2e:
  case 0x2f:
    OPNBase::SetPrescaler(&this->super_OPNBase,addr - 0x2d);
    break;
  case 0xa8:
  case 0xa9:
  case 0xaa:
    this->fnum3[(int)local_1c] = data + (uint)this->fnum2[(int)(local_1c + 6)] * 0x100;
    break;
  case 0xac:
  case 0xad:
  case 0xae:
    this->fnum2[(int)(local_1c + 6)] = data_00;
    break;
  case 0x1a0:
  case 0x1a1:
  case 0x1a2:
    local_1c = local_1c + 3;
  case 0xa0:
  case 0xa1:
  case 0xa2:
    this->fnum[(int)local_1c] = data + (uint)this->fnum2[(int)local_1c] * 0x100;
    Channel4::SetFNum((Channel4 *)(this->adpcmreg + (long)(int)local_1c * 0x2e0 + 0xf),
                      this->fnum[(int)local_1c]);
    break;
  case 0x1a4:
  case 0x1a5:
  case 0x1a6:
    local_1c = local_1c + 3;
  case 0xa4:
  case 0xa5:
  case 0xa6:
    this->fnum2[(int)local_1c] = data_00;
    break;
  case 0x1b0:
  case 0x1b1:
  case 0x1b2:
    local_1c = local_1c + 3;
  case 0xb0:
  case 0xb1:
  case 0xb2:
    Channel4::SetFB((Channel4 *)(this->adpcmreg + (long)(int)local_1c * 0x2e0 + 0xf),data >> 3 & 7);
    Channel4::SetAlgorithm
              ((Channel4 *)(this->adpcmreg + (long)(int)local_1c * 0x2e0 + 0xf),data & 7);
    break;
  case 0x1b4:
  case 0x1b5:
  case 0x1b6:
    local_1c = local_1c + 3;
  case 0xb4:
  case 0xb5:
  case 0xb6:
    this->pan[(int)local_1c] = (byte)(data >> 6) & 3;
    Channel4::SetMS((Channel4 *)(this->adpcmreg + (long)(int)local_1c * 0x2e0 + 0xf),data);
  }
  return;
}

Assistant:

void OPNABase::SetReg(uint addr, uint data)
{
	int	c = addr & 3;
	switch (addr)
	{
		uint modified;

	// Timer -----------------------------------------------------------------
		case 0x24: case 0x25:
			SetTimerA(addr, data);
			break;

		case 0x26:
			SetTimerB(data);
			break;

		case 0x27:
			SetTimerControl(data);
			break;

	// Misc ------------------------------------------------------------------
	case 0x28:		// Key On/Off
		if ((data & 3) < 3)
		{
			c = (data & 3) + (data & 4 ? 3 : 0);
			ch[c].KeyControl(data >> 4);
		}
		break;

	// Status Mask -----------------------------------------------------------
	case 0x29:
		reg29 = data;
//		UpdateStatus(); //?
		break;

	// Prescaler -------------------------------------------------------------
	case 0x2d: case 0x2e: case 0x2f:
		SetPrescaler(addr-0x2d);
		break;

	// F-Number --------------------------------------------------------------
	case 0x1a0:	case 0x1a1: case 0x1a2:
		c += 3;
		// fall through
	case 0xa0:	case 0xa1: case 0xa2:
		fnum[c] = data + fnum2[c] * 0x100;
		ch[c].SetFNum(fnum[c]);
		break;

	case 0x1a4:	case 0x1a5: case 0x1a6:
		c += 3;
		// fall through
	case 0xa4 : case 0xa5: case 0xa6:
		fnum2[c] = uint8(data);
		break;

	case 0xa8:	case 0xa9: case 0xaa:
		fnum3[c] = data + fnum2[c+6] * 0x100;
		break;

	case 0xac : case 0xad: case 0xae:
		fnum2[c+6] = uint8(data);
		break;

	// Algorithm -------------------------------------------------------------

	case 0x1b0:	case 0x1b1:  case 0x1b2:
		c += 3;
		// fall through
	case 0xb0:	case 0xb1:  case 0xb2:
		ch[c].SetFB((data >> 3) & 7);
		ch[c].SetAlgorithm(data & 7);
		break;

	case 0x1b4: case 0x1b5: case 0x1b6:
		c += 3;
		// fall through
	case 0xb4: case 0xb5: case 0xb6:
		pan[c] = (data >> 6) & 3;
		ch[c].SetMS(data);
		break;

	// LFO -------------------------------------------------------------------
	case 0x22:
		modified = reg22 ^ data;
		reg22 = data;
		if (modified & 0x8)
			lfocount = 0;
		lfodcount = reg22 & 8 ? lfotable[reg22 & 7] : 0;
		break;

	// PSG -------------------------------------------------------------------
	case  0: case  1: case  2: case  3: case  4: case  5: case  6: case  7:
	case  8: case  9: case 10: case 11: case 12: case 13: case 14: case 15:
		psg.SetReg(addr, data);
		break;

	// ���F ------------------------------------------------------------------
	default:
		if (c < 3)
		{
			if (addr & 0x100)
				c += 3;
			OPNBase::SetParameter(&ch[c], addr, data);
		}
		break;
	}
}